

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O1

_Bool do_pppp_flags(DisasContext_conflict1 *s,arg_rprr_s *a,GVecGen4_conflict1 *gvec_op)

{
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var1;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  int iVar2;
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGTemp *ts_01;
  TCGTemp *ts_02;
  uint32_t oprsz;
  uint32_t dofs;
  uint32_t aofs;
  uint32_t bofs;
  uint32_t aofs_00;
  uint32_t local_70;
  
  tcg_ctx = s->uc->tcg_ctx;
  _Var1 = sve_access_check_aarch64(s);
  if (!_Var1) {
    return _Var1;
  }
  iVar2 = s->sve_len >> 3;
  oprsz = 8;
  if (8 < iVar2) {
    oprsz = iVar2 + 0xfU & 0x7ffffff0;
  }
  dofs = a->rd * 0x20 + 0x2c10;
  aofs = a->rn * 0x20 + 0x2c10;
  bofs = a->rm * 0x20 + 0x2c10;
  aofs_00 = a->pg * 0x20 + 0x2c10;
  if (iVar2 < 9) {
    ts = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
    ts_00 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
    ts_01 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
    ts_02 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
    tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_ld_i64,(TCGArg)ts_00,
                        (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(long)(int)aofs);
    tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_ld_i64,(TCGArg)ts_01,
                        (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(long)(int)bofs);
    tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_ld_i64,(TCGArg)ts_02,
                        (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(long)(int)aofs_00);
    (*gvec_op->fni8)(tcg_ctx,(TCGv_i64)((long)ts - (long)tcg_ctx),
                     (TCGv_i64)((long)ts_00 - (long)tcg_ctx),(TCGv_i64)((long)ts_01 - (long)tcg_ctx)
                     ,(TCGv_i64)((long)ts_02 - (long)tcg_ctx));
    tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_st_i64,(TCGArg)ts,
                        (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),(long)(int)dofs);
    do_predtest1(tcg_ctx,(TCGv_i64)((long)ts - (long)tcg_ctx),
                 (TCGv_i64)((long)ts_02 - (long)tcg_ctx));
    tcg_temp_free_internal_aarch64(tcg_ctx,ts);
    tcg_temp_free_internal_aarch64(tcg_ctx,ts_00);
    tcg_temp_free_internal_aarch64(tcg_ctx,ts_01);
    tcg_temp_free_internal_aarch64(tcg_ctx,ts_02);
    return (_Bool)extraout_AL;
  }
  local_70 = aofs_00;
  if (a->rd == a->pg) {
    local_70 = 0x2e30;
    tcg_gen_gvec_mov_aarch64(tcg_ctx,0,0x2e30,aofs_00,oprsz,oprsz);
  }
  tcg_gen_gvec_4_aarch64(tcg_ctx,dofs,aofs,bofs,aofs_00,oprsz,oprsz,gvec_op);
  do_predtest(s,dofs,local_70,oprsz >> 3);
  return (_Bool)extraout_AL_00;
}

Assistant:

static bool do_pppp_flags(DisasContext *s, arg_rprr_s *a,
                          const GVecGen4 *gvec_op)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (!sve_access_check(s)) {
        return true;
    }

    unsigned psz = pred_gvec_reg_size(s);
    int dofs = pred_full_reg_offset(s, a->rd);
    int nofs = pred_full_reg_offset(s, a->rn);
    int mofs = pred_full_reg_offset(s, a->rm);
    int gofs = pred_full_reg_offset(s, a->pg);

    if (psz == 8) {
        /* Do the operation and the flags generation in temps.  */
        TCGv_i64 pd = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 pn = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 pm = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 pg = tcg_temp_new_i64(tcg_ctx);

        tcg_gen_ld_i64(tcg_ctx, pn, tcg_ctx->cpu_env, nofs);
        tcg_gen_ld_i64(tcg_ctx, pm, tcg_ctx->cpu_env, mofs);
        tcg_gen_ld_i64(tcg_ctx, pg, tcg_ctx->cpu_env, gofs);

        gvec_op->fni8(tcg_ctx, pd, pn, pm, pg);
        tcg_gen_st_i64(tcg_ctx, pd, tcg_ctx->cpu_env, dofs);

        do_predtest1(tcg_ctx, pd, pg);

        tcg_temp_free_i64(tcg_ctx, pd);
        tcg_temp_free_i64(tcg_ctx, pn);
        tcg_temp_free_i64(tcg_ctx, pm);
        tcg_temp_free_i64(tcg_ctx, pg);
    } else {
        /* The operation and flags generation is large.  The computation
         * of the flags depends on the original contents of the guarding
         * predicate.  If the destination overwrites the guarding predicate,
         * then the easiest way to get this right is to save a copy.
          */
        int tofs = gofs;
        if (a->rd == a->pg) {
            tofs = offsetof(CPUARMState, vfp.preg_tmp);
            tcg_gen_gvec_mov(tcg_ctx, 0, tofs, gofs, psz, psz);
        }

        tcg_gen_gvec_4(tcg_ctx, dofs, nofs, mofs, gofs, psz, psz, gvec_op);
        do_predtest(s, dofs, tofs, psz / 8);
    }
    return true;
}